

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void check_table(wasm_table_t *table,int32_t i,_Bool expect_set)

{
  long lVar1;
  wasm_ref_t *ref;
  _Bool expect_set_local;
  int32_t i_local;
  wasm_table_t *table_local;
  
  lVar1 = wasm_table_get(table,i);
  check((lVar1 != 0) == expect_set);
  if (lVar1 != 0) {
    wasm_ref_delete(lVar1);
  }
  return;
}

Assistant:

void check_table(wasm_table_t* table, int32_t i, bool expect_set) {
  own wasm_ref_t* ref = wasm_table_get(table, i);
  check((ref != NULL) == expect_set);
  if (ref) wasm_ref_delete(ref);
}